

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_lib.cpp
# Opt level: O0

ze_result_t __thiscall
ze_lib::context_t::Init
          (context_t *this,ze_init_flags_t flags,bool sysmanOnly,ze_init_driver_type_desc_t *desc)

{
  long lVar1;
  void *pvVar2;
  ze_result_t result_00;
  undefined1 local_258 [71];
  allocator local_211;
  string local_210 [8];
  string message_4;
  bool local_1e9;
  undefined1 local_1e8 [7];
  bool requireDdiReinit;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [8];
  string message_3;
  undefined1 local_180 [71];
  allocator local_139;
  string local_138 [8];
  string message_2;
  undefined1 local_118 [71];
  allocator local_d1;
  string local_d0 [8];
  string message_1;
  undefined1 local_b0 [87];
  allocator local_59;
  string local_58 [8];
  string message;
  context_t *loaderContext;
  ze_result_t zStack_24;
  bool loaderContextAccessAllowed;
  ze_api_version_t version;
  ze_result_t result;
  ze_init_driver_type_desc_t *desc_local;
  bool sysmanOnly_local;
  ze_init_flags_t flags_local;
  context_t *this_local;
  
  zStack_24 = zeLoaderInit();
  if (zStack_24 == ZE_RESULT_SUCCESS) {
    pvVar2 = zeLoaderGetTracingHandle();
    this->tracing_lib = pvVar2;
    std::atomic<_ze_dditable_t_*>::exchange
              ((atomic<_ze_dditable_t_*> *)(context + 0x10),(__pointer_type)(context + 0x58),
               memory_order_seq_cst);
    std::atomic<_zet_dditable_t_*>::exchange
              ((atomic<_zet_dditable_t_*> *)(context + 0x18),(__pointer_type)(context + 0x6b0),
               memory_order_seq_cst);
    std::atomic<_zes_dditable_t_*>::exchange
              ((atomic<_zes_dditable_t_*> *)(context + 0x20),(__pointer_type)(context + 0x8d8),
               memory_order_seq_cst);
  }
  lVar1 = loader::context;
  if (sysmanOnly) {
    *(long *)(loader::context + 0x1610) = loader::context + 0x15f8;
  }
  result_00 = (ze_result_t)this;
  if ((zStack_24 == ZE_RESULT_SUCCESS) &&
     (zStack_24 = zeDdiTableInit(this,ZE_API_VERSION_1_13), zStack_24 != ZE_RESULT_SUCCESS)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_58,"ze_lib Context Init() zeDdiTableInit failed with ",&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::__cxx11::string::string((string *)(local_b0 + 0x20),local_58);
    to_string_abi_cxx11_((context_t *)local_b0,result_00);
    debug_trace_message(this,(string *)(local_b0 + 0x20),(string *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)(local_b0 + 0x20));
    std::__cxx11::string::~string(local_58);
  }
  if ((zStack_24 == ZE_RESULT_SUCCESS) &&
     (zStack_24 = zetDdiTableInit(this,ZE_API_VERSION_1_13), zStack_24 != ZE_RESULT_SUCCESS)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_d0,"ze_lib Context Init() zetDdiTableInit failed with ",&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::string((string *)(local_118 + 0x20),local_d0);
    to_string_abi_cxx11_((context_t *)local_118,result_00);
    debug_trace_message(this,(string *)(local_118 + 0x20),(string *)local_118);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)(local_118 + 0x20));
    std::__cxx11::string::~string(local_d0);
  }
  if ((zStack_24 == ZE_RESULT_SUCCESS) &&
     (zStack_24 = zesDdiTableInit(this,ZE_API_VERSION_1_13), zStack_24 != ZE_RESULT_SUCCESS)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_138,"ze_lib Context Init() zesDdiTableInit failed with ",&local_139);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::__cxx11::string::string((string *)(local_180 + 0x20),local_138);
    to_string_abi_cxx11_((context_t *)local_180,result_00);
    debug_trace_message(this,(string *)(local_180 + 0x20),(string *)local_180);
    std::__cxx11::string::~string((string *)local_180);
    std::__cxx11::string::~string((string *)(local_180 + 0x20));
    std::__cxx11::string::~string(local_138);
  }
  if ((zStack_24 == ZE_RESULT_SUCCESS) &&
     (zStack_24 = zelTracingDdiTableInit(this,ZE_API_VERSION_1_13), zStack_24 != ZE_RESULT_SUCCESS))
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1a0,"ze_lib Context Init() zelTracingDdiTableInit failed with ",&local_1a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::__cxx11::string::string(local_1c8,local_1a0);
    to_string_abi_cxx11_((context_t *)local_1e8,result_00);
    debug_trace_message(this,(string *)local_1c8,(string *)local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_1a0);
  }
  if (zStack_24 == ZE_RESULT_SUCCESS) {
    zStack_24 = zelLoaderTracingLayerInit(&this->pTracingZeDdiTable);
  }
  if (zStack_24 == ZE_RESULT_SUCCESS) {
    local_1e9 = false;
    zStack_24 = zelLoaderDriverCheck
                          (flags,desc,(ze_global_dditable_t *)(context + 0xe0),
                           (zes_global_dditable_t *)(context + 0x8d8),&local_1e9,sysmanOnly);
    if (zStack_24 != ZE_RESULT_SUCCESS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_210,"ze_lib Context Init() zelLoaderDriverCheck failed with ",&local_211);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      std::__cxx11::string::string((string *)(local_258 + 0x20),local_210);
      to_string_abi_cxx11_((context_t *)local_258,result_00);
      debug_trace_message(this,(string *)(local_258 + 0x20),(string *)local_258);
      std::__cxx11::string::~string((string *)local_258);
      std::__cxx11::string::~string((string *)(local_258 + 0x20));
      std::__cxx11::string::~string(local_210);
    }
    if ((local_1e9 & 1U) != 0) {
      if ((!sysmanOnly) && ((*(byte *)(context + 0xd92) & 1) == 0)) {
        if (zStack_24 == ZE_RESULT_SUCCESS) {
          zStack_24 = zeDdiTableInit(this,ZE_API_VERSION_1_13);
        }
        if (zStack_24 == ZE_RESULT_SUCCESS) {
          zStack_24 = zetDdiTableInit(this,ZE_API_VERSION_1_13);
        }
        *(undefined1 *)(lVar1 + 0x1650) = 0;
      }
      if ((((*(byte *)(context + 0xd91) & 1) == 0) && ((*(byte *)(context + 0xd92) & 1) == 0)) &&
         (zStack_24 == ZE_RESULT_SUCCESS)) {
        zStack_24 = zesDdiTableInit(this,ZE_API_VERSION_1_13);
      }
    }
  }
  if (zStack_24 == ZE_RESULT_SUCCESS) {
    this->isInitialized = true;
  }
  return zStack_24;
}

Assistant:

__zedlllocal ze_result_t context_t::Init(ze_init_flags_t flags, bool sysmanOnly, ze_init_driver_type_desc_t* desc)
    {
        ze_result_t result;
        ze_api_version_t version = ZE_API_VERSION_CURRENT;
#ifdef DYNAMIC_LOAD_LOADER
        std::string loaderLibraryPath;
        auto loaderLibraryPathEnv = getenv_string("ZEL_LIBRARY_PATH");
        if (!loaderLibraryPathEnv.empty()) {
            loaderLibraryPath = loaderLibraryPathEnv;
        }
#ifdef _WIN32
        else {
            loaderLibraryPath = readLevelZeroLoaderLibraryPath();
        }
#endif
        if (debugTraceEnabled)
            debug_trace_message("Static Loader Using Loader Library Path: ", loaderLibraryPath);
        std::string loaderFullLibraryPath = create_library_path(MAKE_LIBRARY_NAME( "ze_loader", L0_LOADER_VERSION), loaderLibraryPath.c_str());
        loader = LOAD_DRIVER_LIBRARY(loaderFullLibraryPath.c_str());

        if( NULL == loader ) {
            std::string message = "ze_lib Context Init() Loader Library Load Failed with ";
            debug_trace_message(message, to_string(ZE_RESULT_ERROR_UNINITIALIZED));
            return ZE_RESULT_ERROR_UNINITIALIZED;
        }

        typedef ze_result_t (ZE_APICALL *loaderInit_t)();
        auto loaderInit = reinterpret_cast<loaderInit_t>(
                GET_FUNCTION_PTR(loader, "zeLoaderInit") );
        result = loaderInit();
        if( ZE_RESULT_SUCCESS != result ) {
            std::string message = "ze_lib Context Init() Loader Init Failed with ";
            debug_trace_message(message, to_string(result));
            return result;
        }

        size_t size = 0;
        result = zelLoaderGetVersions(&size, nullptr);
        if (ZE_RESULT_SUCCESS != result) {
            std::string message = "ze_lib Context Init() zelLoaderGetVersions Failed with";
            debug_trace_message(message, to_string(result));
            return result;
        }

        std::vector<zel_component_version_t> versions(size);
        result = zelLoaderGetVersions(&size, versions.data());
        if (ZE_RESULT_SUCCESS != result) {
            std::string message = "ze_lib Context Init() zelLoaderGetVersions Failed to read component versions with ";
            debug_trace_message(message, to_string(result));
            return result;
        }

        bool zeInitDriversSupport = true;
        const std::string loader_name = "loader";
        for (auto &component : versions) {
            if (loader_name == component.component_name) {
                version = component.spec_version;
                std::string message = "ze_lib Context Init() Static Loader Found Loader Version v" + std::to_string(component.component_lib_version.major) + "." + std::to_string(component.component_lib_version.minor) + "." + std::to_string(component.component_lib_version.patch);
                debug_trace_message(message, "");
                if(component.component_lib_version.major == 1) {
                    if (component.component_lib_version.minor < 18) {
                        std::string message = "ze_lib Context Init() Version Does not support zeInitDrivers";
                        debug_trace_message(message, "");
                        zeInitDriversSupport = false;
                    }
                } else {
                    std::string message = "ze_lib Context Init() Loader version is too new, returning ";
                    debug_trace_message(message, to_string(ZE_RESULT_ERROR_UNSUPPORTED_VERSION));
                    return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
                }
            }
        }

        typedef HMODULE (ZE_APICALL *getTracing_t)();
        auto getTracing = reinterpret_cast<getTracing_t>(
            GET_FUNCTION_PTR(loader, "zeLoaderGetTracingHandle") );
        if (getTracing == nullptr) {
            std::string message = "ze_lib Context Init() zeLoaderGetTracingHandle missing, returning ";
            debug_trace_message(message, to_string(ZE_RESULT_ERROR_UNINITIALIZED));
            return ZE_RESULT_ERROR_UNINITIALIZED;
        }
        tracing_lib = getTracing();
        typedef ze_result_t (ZE_APICALL *zelLoaderTracingLayerInit_t)(std::atomic<ze_dditable_t *> &zeDdiTable);
        auto loaderTracingLayerInit = reinterpret_cast<zelLoaderTracingLayerInit_t>(
                GET_FUNCTION_PTR(loader, "zelLoaderTracingLayerInit") );
        if (loaderTracingLayerInit == nullptr) {
            std::string message = "ze_lib Context Init() zelLoaderTracingLayerInit missing, disabling dynamic tracer support ";
            debug_trace_message(message, "");
            this->dynamicTracingSupported = false;
        }
        typedef loader::context_t * (ZE_APICALL *zelLoaderGetContext_t)();
        auto loaderGetContext = reinterpret_cast<zelLoaderGetContext_t>(
                GET_FUNCTION_PTR(loader, "zelLoaderGetContext") );
        if (loaderGetContext == nullptr) {
            std::string message = "ze_lib Context Init() zelLoaderGetContext missing";
            debug_trace_message(message, "");
        }

        std::string version_message = "Loader API Version to be requested is v" + std::to_string(ZE_MAJOR_VERSION(version)) + "." + std::to_string(ZE_MINOR_VERSION(version));
        debug_trace_message(version_message, "");
        loaderDriverGet = reinterpret_cast<ze_pfnDriverGet_t>(GET_FUNCTION_PTR(loader, "zeDriverGet"));
#else
        result = zeLoaderInit();
        if( ZE_RESULT_SUCCESS == result ) {
            tracing_lib = zeLoaderGetTracingHandle();
        }

#endif

        if ( ZE_RESULT_SUCCESS == result )
        {
            ze_lib::context->zeDdiTable.exchange(&ze_lib::context->initialzeDdiTable);
            ze_lib::context->zetDdiTable.exchange(&ze_lib::context->initialzetDdiTable);
            ze_lib::context->zesDdiTable.exchange(&ze_lib::context->initialzesDdiTable);
        }

        // Given zesInit, then zesDrivers needs to be used as the sysmanInstanceDrivers;
        bool loaderContextAccessAllowed = true;
#ifdef DYNAMIC_LOAD_LOADER
        loader::context_t *loaderContext = nullptr;
        if (loaderGetContext == nullptr) {
            loaderContextAccessAllowed = false;
        } else {
            loaderContext = loaderGetContext();
        }
#else
        loader::context_t *loaderContext = loader::context;
#endif
        if (sysmanOnly && loaderContextAccessAllowed) {
            loaderContext->sysmanInstanceDrivers = &loaderContext->zesDrivers;
        }

        // Always call the inits for all the ddi tables before checking which drivers are usable to enable Instrumentation correctly.

        // Init the ZE DDI Tables
        if( ZE_RESULT_SUCCESS == result )
        {
            result = zeDdiTableInit(version);
            if (result != ZE_RESULT_SUCCESS) {
                std::string message = "ze_lib Context Init() zeDdiTableInit failed with ";
                debug_trace_message(message, to_string(result));
            }
        }
        // Init the ZET DDI Tables
        if( ZE_RESULT_SUCCESS == result )
        {
            result = zetDdiTableInit(version);
            if( ZE_RESULT_SUCCESS != result ) {
                std::string message = "ze_lib Context Init() zetDdiTableInit failed with ";
                debug_trace_message(message, to_string(result));
            }
        }
        // Init the ZES DDI Tables
        if( ZE_RESULT_SUCCESS == result )
        {
            result = zesDdiTableInit(version);
            if (result != ZE_RESULT_SUCCESS) {
                std::string message = "ze_lib Context Init() zesDdiTableInit failed with ";
                debug_trace_message(message, to_string(result));
            }
        }
        // Init the Tracing API DDI Tables
        if( ZE_RESULT_SUCCESS == result )
        {
            result = zelTracingDdiTableInit(version);
            if (result != ZE_RESULT_SUCCESS) {
                std::string message = "ze_lib Context Init() zelTracingDdiTableInit failed with ";
                debug_trace_message(message, to_string(result));
            }
        }
        // Init the stored ddi tables for the tracing layer
        if( ZE_RESULT_SUCCESS == result )
        {
            #ifdef DYNAMIC_LOAD_LOADER
            if (loaderTracingLayerInit) {
                result = loaderTracingLayerInit(this->pTracingZeDdiTable);
            }
            #else
            result = zelLoaderTracingLayerInit(this->pTracingZeDdiTable);
            #endif
        }
        // End DDI Table Inits

        // Check which drivers and layers can be init on this system.
        if( ZE_RESULT_SUCCESS == result)
        {
            // Check which drivers support the ze_driver_flag_t specified
            // No need to check if only initializing sysman
            bool requireDdiReinit = false;
            #ifdef DYNAMIC_LOAD_LOADER
            if (zeInitDriversSupport) {
                typedef ze_result_t (ZE_APICALL *zelLoaderDriverCheck_t)(ze_init_flags_t flags, ze_init_driver_type_desc_t* desc, ze_global_dditable_t *globalInitStored, zes_global_dditable_t *sysmanGlobalInitStored, bool *requireDdiReinit, bool sysmanOnly);
                auto loaderDriverCheck = reinterpret_cast<zelLoaderDriverCheck_t>(
                        GET_FUNCTION_PTR(loader, "zelLoaderDriverCheck") );
                if (loaderDriverCheck == nullptr) {
                    std::string message = "ze_lib Context Init() zelLoaderDriverCheck missing, returning ";
                    debug_trace_message(message, to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                    return ZE_RESULT_ERROR_UNINITIALIZED;
                }
                result = loaderDriverCheck(flags, desc, &ze_lib::context->initialzeDdiTable.Global, &ze_lib::context->initialzesDdiTable.Global, &requireDdiReinit, sysmanOnly);
            } else {
                typedef ze_result_t (ZE_APICALL *zelLoaderDriverCheck_t)(ze_init_flags_t flags, ze_global_dditable_t *globalInitStored, zes_global_dditable_t *sysmanGlobalInitStored, bool *requireDdiReinit, bool sysmanOnly);
                auto loaderDriverCheck = reinterpret_cast<zelLoaderDriverCheck_t>(
                        GET_FUNCTION_PTR(loader, "zelLoaderDriverCheck") );
                if (loaderDriverCheck == nullptr) {
                    std::string message = "ze_lib Context Init() zelLoaderDriverCheck missing, returning ";
                    debug_trace_message(message, to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                    return ZE_RESULT_ERROR_UNINITIALIZED;
                }
                result = loaderDriverCheck(flags, &ze_lib::context->initialzeDdiTable.Global, &ze_lib::context->initialzesDdiTable.Global, &requireDdiReinit, sysmanOnly);
            }
            #else
            result = zelLoaderDriverCheck(flags, desc, &ze_lib::context->initialzeDdiTable.Global, &ze_lib::context->initialzesDdiTable.Global, &requireDdiReinit, sysmanOnly);
            #endif
            if (result != ZE_RESULT_SUCCESS) {
                std::string message = "ze_lib Context Init() zelLoaderDriverCheck failed with ";
                debug_trace_message(message, to_string(result));
            }
            // If a driver was removed from the driver list, then the ddi tables need to be reinit to allow for passthru directly to the driver.
            if (requireDdiReinit && loaderContextAccessAllowed) {
                // If a user has already called the core apis, then ddi table reinit is not possible due to handles already being read by the user.
                if (!sysmanOnly && !ze_lib::context->zeInuse) {
                    // reInit the ZE DDI Tables
                    if( ZE_RESULT_SUCCESS == result )
                    {
                        result = zeDdiTableInit(version);
                    }
                    // reInit the ZET DDI Tables
                    if( ZE_RESULT_SUCCESS == result )
                    {
                        result = zetDdiTableInit(version);
                    }
                    // If ze/zet ddi tables have been reinit and no longer use the intercept layer, then handles passed to zelLoaderTranslateHandleInternal do not require translation.
                    // Setting intercept_enabled==false changes the behavior of zelLoaderTranslateHandleInternal to avoid translation.
                    // Translation is only required if the intercept layer is enabled for the ZE handle types.
                    loaderContext->intercept_enabled = false;
                }
                // If a user has already called the zes/ze apis, then ddi table reinit is not possible due to handles already being read by the user.
                if (!(ze_lib::context->zesInuse || ze_lib::context->zeInuse)) {
                    // reInit the ZES DDI Tables
                    if( ZE_RESULT_SUCCESS == result )
                    {
                        result = zesDdiTableInit(version);
                    }
                }
            }
        }

        if( ZE_RESULT_SUCCESS == result )
        {
#ifdef DYNAMIC_LOAD_LOADER
            // Init Dynamic Loader's Lib Context:
            auto initDriversLoader = reinterpret_cast<ze_pfnInitDrivers_t>(
                GET_FUNCTION_PTR(loader, "zeInitDrivers") );
            auto initLoader = reinterpret_cast<ze_pfnInit_t>(
                GET_FUNCTION_PTR(loader, "zeInit") );
            if (initDriversLoader == nullptr && initLoader == nullptr) {
                std::string message = "ze_lib Context Init() zeInitDrivers and zeInit missing, returning ";
                debug_trace_message(message, to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                return ZE_RESULT_ERROR_UNINITIALIZED;
            }
            if (!desc) {
                result = initLoader(flags);
            } else if (initDriversLoader != nullptr) {
                uint32_t pInitDriversCount = 0;
                result = initDriversLoader(&pInitDriversCount, nullptr, desc);
            } else {
                ze_init_flags_t init_flags = flags;
                if (desc) {
                    if(desc->flags & ZE_INIT_DRIVER_TYPE_FLAG_GPU) {
                        init_flags = ZE_INIT_FLAG_GPU_ONLY;
                    } else if(desc->flags & ZE_INIT_DRIVER_TYPE_FLAG_NPU) {
                        init_flags = ZE_INIT_FLAG_VPU_ONLY;
                    } else {
                        init_flags = 0;
                    }
                }
                result = initLoader(init_flags);
            }
            if (result != ZE_RESULT_SUCCESS) {
                std::string message = "ze_lib Context Init() zeInitDrivers or zeInit failed with ";
                debug_trace_message(message, to_string(result));
                return result;
            }
#endif
            isInitialized = true;
        }
        #ifdef DYNAMIC_LOAD_LOADER
        if (!delayContextDestruction) {
            std::atexit(context_at_exit_destructor);
        }
        #endif
        return result;
    }